

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_noise_table.c
# Opt level: O3

void GenerateLumaGrainBlock
               (RK_S32 (*luma_grain_block) [82],RK_S32 bitdepth,RK_U8 num_y_points,
               RK_S32 grain_scale_shift,RK_S32 ar_coeff_lag,RK_S32 *ar_coeffs_y,
               RK_S32 ar_coeff_shift,RK_S32 grain_min,RK_S32 grain_max,RK_U16 random_seed)

{
  char cVar1;
  long lVar2;
  long lVar3;
  RK_S32 RVar4;
  long lVar5;
  RK_S32 a;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ushort uVar10;
  RK_U16 random_reg;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  RK_S32 (*paRVar17) [82];
  ulong uVar11;
  
  uVar11 = (ulong)random_seed;
  cVar1 = (char)grain_scale_shift - (char)bitdepth;
  lVar16 = 0;
  paRVar17 = luma_grain_block;
  do {
    lVar13 = 0;
    do {
      if (num_y_points == '\0') {
        iVar8 = 0;
      }
      else {
        uVar10 = (ushort)uVar11 >> 1 |
                 ((ushort)(uVar11 >> 0xc) ^ (ushort)(uVar11 >> 3) ^
                 (ushort)(uVar11 >> 1) ^ (ushort)uVar11) << 0xf;
        uVar11 = (ulong)uVar10;
        iVar8 = gaussian_sequence[uVar10 >> 5] + (1 << (cVar1 + 0xbU & 0x1f)) >>
                (cVar1 + 0xcU & 0x1f);
      }
      (*paRVar17)[lVar13] = iVar8;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x52);
    lVar16 = lVar16 + 1;
    paRVar17 = paRVar17 + 1;
  } while (lVar16 != 0x49);
  lVar16 = (long)-ar_coeff_lag;
  lVar14 = (long)luma_grain_block + lVar16 * 0x14c + 0x3e4;
  lVar13 = 3;
  do {
    lVar7 = 3;
    lVar15 = lVar14;
    do {
      if (ar_coeff_lag < 0) {
        iVar8 = 0;
      }
      else {
        iVar8 = 0;
        iVar12 = 0;
        lVar5 = lVar15;
        lVar6 = lVar16;
        do {
          if ((int)lVar6 != 0 || -ar_coeff_lag != 0) {
            lVar2 = (long)iVar12;
            lVar9 = 0;
            lVar3 = lVar16;
            do {
              iVar8 = *(int *)(lVar5 + lVar9) * *(int *)((long)ar_coeffs_y + lVar9 + lVar2 * 4) +
                      iVar8;
              iVar12 = iVar12 + 1;
              if (ar_coeff_lag <= lVar3) break;
              lVar3 = lVar3 + 1;
              lVar9 = lVar9 + 4;
            } while ((int)lVar3 != 0 || (int)lVar6 != 0);
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x148;
        } while ((int)lVar6 != 1);
      }
      iVar8 = (iVar8 + (1 << ((byte)ar_coeff_shift - 1 & 0x1f)) >> ((byte)ar_coeff_shift & 0x1f)) +
              luma_grain_block[lVar13][lVar7];
      RVar4 = grain_max;
      if (iVar8 < grain_max) {
        RVar4 = iVar8;
      }
      if (iVar8 < grain_min) {
        RVar4 = grain_min;
      }
      luma_grain_block[lVar13][lVar7] = RVar4;
      lVar7 = lVar7 + 1;
      lVar15 = lVar15 + 4;
    } while (lVar7 != 0x4f);
    lVar13 = lVar13 + 1;
    lVar14 = lVar14 + 0x148;
    if (lVar13 == 0x49) {
      return;
    }
  } while( true );
}

Assistant:

void GenerateLumaGrainBlock(RK_S32 luma_grain_block[][82], RK_S32 bitdepth,
                            RK_U8 num_y_points, RK_S32 grain_scale_shift,
                            RK_S32 ar_coeff_lag, RK_S32 ar_coeffs_y[],
                            RK_S32 ar_coeff_shift, RK_S32 grain_min, RK_S32 grain_max,
                            RK_U16 random_seed)
{
    RK_S32 gauss_sec_shift = 12 - bitdepth + grain_scale_shift;
    RK_U16 grain_random_register = random_seed;
    RK_S32 i, j;
    for (i = 0; i < 73; i++) {
        for (j = 0; j < 82; j++) {
            if (num_y_points > 0) {
                UpdateRandomRegister(&grain_random_register);
                luma_grain_block[i][j] = RoundPowerOfTwo(
                                             gaussian_sequence[GetRandomNumber(grain_random_register)],
                                             gauss_sec_shift);
            } else {
                luma_grain_block[i][j] = 0;
            }
        }
    }

    for (i = 3; i < 73; i++)
        for (j = 3; j < 82 - 3; j++) {
            RK_S32 pos = 0;
            RK_S32 wsum = 0;
            RK_S32 deltaRow, deltaCol;
            for (deltaRow = -ar_coeff_lag; deltaRow <= 0; deltaRow++) {
                for (deltaCol = -ar_coeff_lag; deltaCol <= ar_coeff_lag;
                     deltaCol++) {
                    if (deltaRow == 0 && deltaCol == 0) break;
                    wsum = wsum + ar_coeffs_y[pos] *
                           luma_grain_block[i + deltaRow][j + deltaCol];
                    ++pos;
                }
            }
            luma_grain_block[i][j] =
                Clamp(luma_grain_block[i][j] + RoundPowerOfTwo(wsum, ar_coeff_shift),
                      grain_min, grain_max);
        }
}